

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpp_wrapper1.cpp
# Opt level: O1

void cpp_wrapper_setup(planck_unit_test_t *tc,Dictionary<int,_int> *dict,
                      ion_behaviour_fill_level_e fill_level)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  
  switch(fill_level) {
  case ion_fill_edge_cases:
    iVar1 = -0x66;
    iVar3 = -300;
    do {
      iVar1 = iVar1 + 2;
      cpp_wrapper_insert(tc,dict,iVar1,iVar3,'\x01');
      iVar3 = iVar3 + 6;
    } while (iVar1 < -0x34);
  case ion_fill_high:
    uVar2 = 0x1ef;
    iVar1 = 5000;
    do {
      uVar2 = uVar2 + 5;
      cpp_wrapper_insert(tc,dict,uVar2,iVar1,'\x01');
      iVar1 = iVar1 + 0x32;
    } while (uVar2 < 0x3e3);
  case ion_fill_medium:
    uVar2 = 0x30;
    iVar1 = 0xfa;
    do {
      uVar2 = uVar2 + 2;
      cpp_wrapper_insert(tc,dict,uVar2,iVar1,'\x01');
      iVar1 = iVar1 + 10;
    } while (uVar2 < 0x62);
  case ion_fill_low:
    iVar1 = 0;
    iVar3 = 0;
    do {
      cpp_wrapper_insert(tc,dict,iVar3,iVar1,'\x01');
      iVar3 = iVar3 + 1;
      iVar1 = iVar1 + 2;
    } while (iVar3 != 10);
    return;
  default:
    return;
  }
}

Assistant:

void
cpp_wrapper_setup(
	planck_unit_test_t *tc,
	Dictionary<int, int>			*dict,
	ion_behaviour_fill_level_e fill_level
) {
	/* This switch statement intentionally doesn't have breaks - we want it to fall through. */
	int i;

	switch (fill_level) {
		case ion_fill_edge_cases: {
			ION_FILL_EDGE_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 3, boolean_true);
			}
		}

		case ion_fill_high: {
			ION_FILL_HIGH_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 10, boolean_true);
			}
		}

		case ion_fill_medium: {
			ION_FILL_MEDIUM_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 5, boolean_true);
			}
		}

		case ion_fill_low: {
			ION_FILL_LOW_LOOP(i) {
				cpp_wrapper_insert(tc, dict, i, i * 2, boolean_true);
			}
		}

		case ion_fill_none: {
			/* Intentionally left blank */
		}
	}
}